

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

int lex_skipeq(LexState *ls)

{
  int iVar1;
  LexChar LVar2;
  byte *pbVar3;
  SBuf *sb;
  int local_74;
  uint local_6c;
  int local_64;
  LexChar s;
  int count;
  LexState *ls_local;
  char *w;
  char *local_10;
  
  local_64 = 0;
  iVar1 = ls->c;
  while( true ) {
    LVar2 = ls->c;
    sb = &ls->sb;
    if ((int)(ls->sb).e == (int)sb->w) {
      local_10 = lj_buf_more2(sb,1);
    }
    else {
      local_10 = sb->w;
    }
    *local_10 = (char)LVar2;
    sb->w = local_10 + 1;
    if (ls->p < ls->pe) {
      pbVar3 = (byte *)ls->p;
      ls->p = (char *)(pbVar3 + 1);
      local_6c = (uint)*pbVar3;
    }
    else {
      local_6c = lex_more(ls);
    }
    ls->c = local_6c;
    if (local_6c != 0x3d || 0x1fffffff < local_64) break;
    local_64 = local_64 + 1;
  }
  if (ls->c == iVar1) {
    local_74 = local_64;
  }
  else {
    local_74 = -1 - local_64;
  }
  return local_74;
}

Assistant:

static int lex_skipeq(LexState *ls)
{
  int count = 0;
  LexChar s = ls->c;
  lj_assertLS(s == '[' || s == ']', "bad usage");
  while (lex_savenext(ls) == '=' && count < 0x20000000)
    count++;
  return (ls->c == s) ? count : (-count) - 1;
}